

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_audio_buffer_ref_init
                    (ma_format format,ma_uint32 channels,void *pData,ma_uint64 sizeInFrames,
                    ma_audio_buffer_ref *pAudioBufferRef)

{
  if (pAudioBufferRef != (ma_audio_buffer_ref *)0x0) {
    (pAudioBufferRef->ds).vtable = (ma_data_source_vtable *)0x0;
    (pAudioBufferRef->ds).rangeBegInFrames = 0;
    (pAudioBufferRef->ds).rangeEndInFrames = 0;
    (pAudioBufferRef->ds).loopBegInFrames = 0;
    (pAudioBufferRef->ds).loopEndInFrames = 0;
    (pAudioBufferRef->ds).pCurrent = (ma_data_source *)0x0;
    *(undefined8 *)&(pAudioBufferRef->ds).isLooping = 0;
    pAudioBufferRef->format = ma_format_unknown;
    pAudioBufferRef->channels = 0;
    *(undefined8 *)&pAudioBufferRef->sampleRate = 0;
    pAudioBufferRef->cursor = 0;
    pAudioBufferRef->sizeInFrames = 0;
    pAudioBufferRef->pData = (void *)0x0;
    (pAudioBufferRef->ds).pNext = (ma_data_source *)0x0;
    (pAudioBufferRef->ds).onGetNext = (ma_data_source_get_next_proc)0x0;
    (pAudioBufferRef->ds).vtable = &g_ma_audio_buffer_ref_data_source_vtable;
    (pAudioBufferRef->ds).rangeBegInFrames = 0;
    (pAudioBufferRef->ds).rangeEndInFrames = 0xffffffffffffffff;
    (pAudioBufferRef->ds).loopBegInFrames = 0;
    (pAudioBufferRef->ds).loopEndInFrames = 0xffffffffffffffff;
    (pAudioBufferRef->ds).pCurrent = pAudioBufferRef;
    pAudioBufferRef->format = format;
    pAudioBufferRef->channels = channels;
    pAudioBufferRef->sampleRate = 0;
    pAudioBufferRef->cursor = 0;
    pAudioBufferRef->sizeInFrames = sizeInFrames;
    pAudioBufferRef->pData = pData;
    return MA_SUCCESS;
  }
  return MA_INVALID_ARGS;
}

Assistant:

MA_API ma_result ma_audio_buffer_ref_init(ma_format format, ma_uint32 channels, const void* pData, ma_uint64 sizeInFrames, ma_audio_buffer_ref* pAudioBufferRef)
{
    ma_result result;
    ma_data_source_config dataSourceConfig;

    if (pAudioBufferRef == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pAudioBufferRef);

    dataSourceConfig = ma_data_source_config_init();
    dataSourceConfig.vtable = &g_ma_audio_buffer_ref_data_source_vtable;

    result = ma_data_source_init(&dataSourceConfig, &pAudioBufferRef->ds);
    if (result != MA_SUCCESS) {
        return result;
    }

    pAudioBufferRef->format       = format;
    pAudioBufferRef->channels     = channels;
    pAudioBufferRef->sampleRate   = 0;  /* TODO: Version 0.12. Set this to sampleRate. */
    pAudioBufferRef->cursor       = 0;
    pAudioBufferRef->sizeInFrames = sizeInFrames;
    pAudioBufferRef->pData        = pData;

    return MA_SUCCESS;
}